

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_strfmt(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000034;
  
  iVar1 = CONCAT31((int3)((uint)in_EAX >> 8),buf == (char *)0x0);
  if ((char *)CONCAT44(in_register_00000034,buf_size) != (char *)0x0 && buf != (char *)0x0) {
    iVar1 = vsnprintf(buf,0x100,(char *)CONCAT44(in_register_00000034,buf_size),fmt);
    buf[0xff] = '\0';
  }
  return iVar1;
}

Assistant:

NK_LIB int
nk_strfmt(char *buf, int buf_size, const char *fmt, va_list args)
{
int result = -1;
NK_ASSERT(buf);
NK_ASSERT(buf_size);
if (!buf || !buf_size || !fmt) return 0;
#ifdef NK_INCLUDE_STANDARD_IO
result = NK_VSNPRINTF(buf, (nk_size)buf_size, fmt, args);
result = (result >= buf_size) ? -1: result;
buf[buf_size-1] = 0;
#else
result = nk_vsnprintf(buf, buf_size, fmt, args);
#endif
return result;
}